

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

void __thiscall dg::vr::GraphBuilder::buildBlocks(GraphBuilder *this,Function *function)

{
  VRCodeGraph *this_00;
  Function *pFVar1;
  VRLocation *loc;
  Function *__range2;
  Instruction *ptr;
  Function *pFVar2;
  
  pFVar2 = *(Function **)(function + 0x50);
  if (pFVar2 != function + 0x48) {
    do {
      pFVar1 = pFVar2 + -0x18;
      if (pFVar2 == (Function *)0x0) {
        pFVar1 = (Function *)0x0;
      }
      buildBlock(this,(BasicBlock *)pFVar1);
      pFVar2 = *(Function **)(pFVar2 + 8);
    } while (pFVar2 != function + 0x48);
    pFVar2 = *(Function **)(function + 0x50);
  }
  this_00 = *(VRCodeGraph **)(this + 8);
  pFVar1 = pFVar2 + -0x18;
  if (pFVar2 == (Function *)0x0) {
    pFVar1 = (Function *)0x0;
  }
  ptr = (Instruction *)(*(long *)(pFVar1 + 0x30) + -0x18);
  if (*(long *)(pFVar1 + 0x30) == 0) {
    ptr = (Instruction *)0x0;
  }
  loc = VRCodeGraph::getVRLocation(this_00,ptr);
  VRCodeGraph::setEntryLocation(this_00,function,loc);
  return;
}

Assistant:

void GraphBuilder::buildBlocks(const llvm::Function &function) {
    for (const llvm::BasicBlock &block : function) {
        assert(!block.empty());
        buildBlock(block);
    }

    codeGraph.setEntryLocation(
            &function,
            codeGraph.getVRLocation(&function.getEntryBlock().front()));
}